

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

void sai_terminate_sparse_arrays(void)

{
  Integer IVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x640000; lVar2 = lVar2 + 200) {
    IVar1 = *(Integer *)((long)&SPA->g_data + lVar2);
    if (GA[IVar1 + 1000].actv == 1) {
      pnga_destroy(IVar1);
    }
    IVar1 = *(Integer *)((long)&SPA->g_i + lVar2);
    if (GA[IVar1 + 1000].actv == 1) {
      pnga_destroy(IVar1);
    }
    IVar1 = *(Integer *)((long)&SPA->g_j + lVar2);
    if (GA[IVar1 + 1000].actv == 1) {
      pnga_destroy(IVar1);
    }
    free(*(void **)((long)&SPA->blkidx + lVar2));
    free(*(void **)((long)&SPA->blksize + lVar2));
    free(*(void **)((long)&SPA->offset + lVar2));
    free(*(void **)((long)&SPA->idx + lVar2));
    free(*(void **)((long)&SPA->jdx + lVar2));
    free(*(void **)((long)&SPA->val + lVar2));
  }
  free(SPA);
  return;
}

Assistant:

void sai_terminate_sparse_arrays()
{
  Integer i;
  for (i=0; i<MAX_ARRAYS; i++) {
    Integer ga = SPA[i].g_data + GA_OFFSET;
    if (GA[ga].actv==1) pnga_destroy(SPA[i].g_data);
    ga = SPA[i].g_i + GA_OFFSET;
    if (GA[ga].actv==1) pnga_destroy(SPA[i].g_i);
    ga = SPA[i].g_j + GA_OFFSET;
    if (GA[ga].actv==1) pnga_destroy(SPA[i].g_j);
    if (SPA[i].blkidx) free(SPA[i].blkidx);
    if (SPA[i].blksize) free(SPA[i].blksize);
    if (SPA[i].offset) free(SPA[i].offset);
    if (SPA[i].idx) free(SPA[i].idx);
    if (SPA[i].jdx) free(SPA[i].jdx);
    if (SPA[i].val) free(SPA[i].val);
  }
  free(SPA);
}